

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

StaticError * __thiscall
jsonnet::internal::anon_unknown_0::Parser::unexpected(Parser *this,Token *tok,string *while_)

{
  StaticError *this_00;
  ostream *poVar1;
  string *in_RCX;
  StaticError *in_RDI;
  stringstream ss;
  undefined8 in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  StaticError *location;
  string local_1d8 [48];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  string *local_20;
  
  location = in_RDI;
  local_20 = in_RCX;
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = (StaticError *)std::operator<<(local_198,"unexpected: ");
  poVar1 = internal::operator<<
                     (in_stack_fffffffffffffe00,(Kind)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  poVar1 = std::operator<<(poVar1," while ");
  std::operator<<(poVar1,local_20);
  std::__cxx11::stringstream::str();
  StaticError::StaticError(this_00,&location->location,(string *)in_RDI);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return location;
}

Assistant:

StaticError unexpected(const Token &tok, const std::string &while_)
    {
        std::stringstream ss;
        ss << "unexpected: " << tok.kind << " while " << while_;
        return StaticError(tok.location, ss.str());
    }